

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalStructInference.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_226::GlobalStructInference::run::FunctionOptimizer::create
          (FunctionOptimizer *this)

{
  undefined1 local_20 [16];
  FunctionOptimizer *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::(anonymous_namespace)::GlobalStructInference&>
            ((GlobalStructInference *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,std::default_delete<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<FunctionOptimizer,_std::default_delete<FunctionOptimizer>_> *)local_20);
  std::unique_ptr<FunctionOptimizer,_std::default_delete<FunctionOptimizer>_>::~unique_ptr
            ((unique_ptr<FunctionOptimizer,_std::default_delete<FunctionOptimizer>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<FunctionOptimizer>(parent);
      }